

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O2

void test_issue304(void)

{
  bool bVar1;
  Roaring64Map roaring;
  Roaring64Map local_48;
  
  local_48.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_48.roarings._M_t._M_impl.super__Rb_tree_header._M_header;
  local_48.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_48.roarings._M_t._M_impl._0_8_ = 0;
  local_48.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_48.roarings._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_48.roarings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48.copyOnWrite = false;
  local_48.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_48.roarings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar1 = ::roaring::Roaring64Map::isFull(&local_48);
  _assert_true((ulong)!bVar1,"roaring.isFull()",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cpp_unit.cpp"
               ,0xae);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_roaring::Roaring>,_std::_Select1st<std::pair<const_unsigned_int,_roaring::Roaring>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_roaring::Roaring>_>_>
               *)&local_48);
  return;
}

Assistant:

DEFINE_TEST(test_example_true) { test_example(true); }